

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model::AddRibosome(Model *this,int footprint,double speed,int copy_number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SpeciesTracker *this_00;
  Polymerase pol;
  string local_c8;
  double local_a8;
  MobileElement local_a0;
  
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = speed;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"__ribosome","");
  Polymerase::Polymerase((Polymerase *)&local_a0,&local_c8,footprint,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::vector<Polymerase,_std::allocator<Polymerase>_>::push_back
            (&this->polymerases_,(value_type *)&local_a0);
  this_00 = SpeciesTracker::Instance();
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"__ribosome","");
  SpeciesTracker::Increment(this_00,&local_c8,copy_number);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  MobileElement::~MobileElement(&local_a0);
  return;
}

Assistant:

void Model::AddRibosome(int footprint, double speed, int copy_number) {
  auto pol = Polymerase("__ribosome", footprint, speed);
  polymerases_.push_back(pol);
  auto &tracker = SpeciesTracker::Instance();
  tracker.Increment("__ribosome", copy_number);
}